

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O0

ostream * Kernel::operator<<(ostream *out,Formula *f)

{
  ostream *poVar1;
  ostream *in_RDI;
  Formula *in_stack_00000458;
  string local_30 [48];
  
  Formula::toString_abi_cxx11_(in_stack_00000458);
  poVar1 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& out, const Formula* f)
{
  return out << f->toString();
}